

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# collationkeys.cpp
# Opt level: O1

void icu_63::CollationKeys::writeSortKeyUpToQuaternary
               (CollationIterator *iter,UBool *compressibleBytes,CollationSettings *settings,
               SortKeyByteSink *sink,Level minLevel,LevelCallback *callback,UBool preflight,
               UErrorCode *errorCode)

{
  char cVar1;
  uint32_t b;
  uint w;
  UBool UVar2;
  uint uVar3;
  ulong uVar4;
  uchar *puVar5;
  uint uVar6;
  uchar *puVar7;
  uchar uVar8;
  uint32_t uVar9;
  byte bVar11;
  ulong uVar10;
  uint uVar12;
  uint uVar13;
  int32_t iVar14;
  uint32_t b_00;
  int appendCapacity;
  bool bVar15;
  char buffer [3];
  SortKeyLevel quaternaries;
  SortKeyLevel secondaries;
  SortKeyLevel tertiaries;
  SortKeyLevel cases;
  undefined1 local_163;
  undefined1 local_162;
  char local_161;
  CollationSettings *local_160;
  uint local_154;
  int local_150;
  uint local_14c;
  LevelCallback *local_148;
  uint local_140;
  uint local_13c;
  SortKeyLevel local_138;
  SortKeyLevel local_f8;
  UBool *local_b8;
  SortKeyLevel local_b0;
  SortKeyLevel local_70;
  
  if (U_ZERO_ERROR < *errorCode) {
    return;
  }
  uVar3 = settings->options;
  uVar12 = (uVar3 >> 7 & 8 | *(uint *)(levelMasks + (long)((int)uVar3 >> 0xc) * 4)) >>
           ((byte)minLevel & 0x1f);
  bVar11 = (byte)minLevel & 0x1f;
  uVar13 = uVar12 << bVar11;
  if (uVar12 << bVar11 == 0) {
    return;
  }
  local_14c = settings->variableTop + 1;
  if ((uVar3 & 0xc) == 0) {
    local_14c = 0;
  }
  local_140 = uVar3 & 0x600;
  local_13c = 0x3f3f;
  if (local_140 == 0x200) {
    local_13c = 0xff3f;
  }
  local_70.buffer.ptr = local_70.buffer.stackArray;
  local_70.buffer.capacity = 0x28;
  local_138.len = 0 << bVar11;
  local_138.buffer.needToRelease = (UBool)local_138.len;
  local_70.ok = '\x01';
  local_f8.buffer.ptr = local_f8.buffer.stackArray;
  local_f8.buffer.capacity = 0x28;
  local_f8.ok = '\x01';
  local_b0.buffer.ptr = local_b0.buffer.stackArray;
  local_b0.buffer.capacity = 0x28;
  local_b0.ok = '\x01';
  local_138.buffer.ptr = local_138.buffer.stackArray;
  local_138.buffer.capacity = 0x28;
  local_138.ok = '\x01';
  local_150 = 0;
  local_154 = 0;
  if (iter->cesIndex == (iter->ceBuffer).length) {
    (iter->ceBuffer).length = 0;
    iter->cesIndex = 0;
  }
  local_160 = settings;
  local_148 = callback;
  local_f8.buffer.needToRelease = local_138.buffer.needToRelease;
  local_f8.len = local_138.len;
  local_b8 = compressibleBytes;
  local_b0.buffer.needToRelease = local_138.buffer.needToRelease;
  local_b0.len = local_138.len;
  local_70.buffer.needToRelease = local_138.buffer.needToRelease;
  local_70.len = local_138.len;
  uVar4 = CollationIterator::nextCE(iter,errorCode);
  uVar10 = uVar4 >> 0x20;
  if ((0x2000000ffffffff < uVar4) && ((uint)(uVar4 >> 0x20) < local_14c)) {
    do {
      uVar9 = (uint32_t)uVar10;
      iVar14 = local_138.len;
      if ((uVar13 & 0x20) != 0) {
        if (settings->reorderTable != (uint8_t *)0x0) {
          bVar11 = settings->reorderTable[uVar10 >> 0x18];
          if (uVar9 < 2 || bVar11 != 0) {
            uVar9 = uVar9 & 0xffffff | (uint)bVar11 << 0x18;
          }
          else {
            uVar9 = CollationSettings::reorderEx(settings,uVar9);
          }
        }
        if (0x1affffff < uVar9) {
          anon_unknown_4::SortKeyLevel::appendByte(&local_138,0x1b);
        }
        uVar8 = (uchar)uVar9;
        if ((uVar9 & 0xff0000) == 0) {
          iVar14 = 1;
        }
        else if ((uVar9 & 0xff00) == 0) {
          iVar14 = 2;
        }
        else {
          iVar14 = 4 - (uint)(uVar8 == '\0');
        }
        if ((local_138.len + iVar14 <= local_138.buffer.capacity) ||
           (UVar2 = anon_unknown_4::SortKeyLevel::ensureCapacity(&local_138,iVar14),
           iVar14 = local_138.len, UVar2 != '\0')) {
          local_138.buffer.ptr[local_138.len] = (uchar)(uVar9 >> 0x18);
          iVar14 = local_138.len + 1;
          if ((uVar9 & 0xff0000) != 0) {
            local_138.buffer.ptr[local_138.len + 1] = (uchar)(uVar9 >> 0x10);
            iVar14 = local_138.len + 2;
            if ((uVar9 & 0xff00) != 0) {
              local_138.buffer.ptr[local_138.len + 2] = (uchar)(uVar9 >> 8);
              iVar14 = local_138.len + 3;
              if (uVar8 != '\0') {
                local_138.buffer.ptr[local_138.len + 3] = uVar8;
                iVar14 = local_138.len + 4;
              }
            }
          }
        }
      }
      do {
        local_138.len = iVar14;
        uVar4 = CollationIterator::nextCE(iter,errorCode);
        uVar10 = uVar4 >> 0x20;
        iVar14 = local_138.len;
      } while (uVar10 == 0);
    } while ((0x2000000ffffffff < uVar4) && ((uint)(uVar4 >> 0x20) < local_14c));
  }
  uVar9 = (uint32_t)uVar10;
  if (((uVar13 & 2) != 0) && (1 < uVar9)) {
    cVar1 = local_b8[uVar10 >> 0x18];
    if (settings->reorderTable != (uint8_t *)0x0) {
      bVar11 = settings->reorderTable[uVar10 >> 0x18];
      if (uVar9 < 2 || bVar11 != 0) {
        uVar10 = (ulong)(uVar9 & 0xffffff | (uint)bVar11 << 0x18);
      }
      else {
        uVar9 = CollationSettings::reorderEx(local_160,uVar9);
        uVar10 = (ulong)uVar9;
      }
    }
    uVar9 = (uint32_t)uVar10;
    b = (uint32_t)(uVar10 >> 0x18);
    if ((cVar1 == '\0') || (b != local_154 >> 0x18)) {
      if ((local_154 != 0) && ((b_00 = 0xff, local_154 <= uVar9 || (b_00 = 3, 0x2ffffff < uVar9))))
      {
        SortKeyByteSink::Append(sink,b_00);
      }
      SortKeyByteSink::Append(sink,b);
      local_154 = 0;
      if (cVar1 != '\0') {
        local_154 = uVar9;
      }
    }
    if ((uVar10 & 0xff0000) != 0) {
      local_163 = (undefined1)(uVar10 >> 0x10);
      local_162 = (undefined1)(uVar10 >> 8);
      local_161 = (char)uVar10;
      uVar12 = 3 - (local_161 == '\0');
      if ((uVar10 & 0xff00) == 0) {
        uVar12 = 1;
      }
      (*(sink->super_ByteSink)._vptr_ByteSink[2])(sink,&local_163,(ulong)uVar12);
    }
    if ((preflight == '\0') && (sink->capacity_ < sink->appended_)) {
      uVar3 = 1;
      if ((*errorCode < U_ILLEGAL_ARGUMENT_ERROR) && (sink->buffer_ == (char *)0x0)) {
        *errorCode = U_MEMORY_ALLOCATION_ERROR;
        MaybeStackArray<unsigned_char,_40>::~MaybeStackArray(&local_138.buffer);
        MaybeStackArray<unsigned_char,_40>::~MaybeStackArray(&local_b0.buffer);
        MaybeStackArray<unsigned_char,_40>::~MaybeStackArray(&local_f8.buffer);
        MaybeStackArray<unsigned_char,_40>::~MaybeStackArray(&local_70.buffer);
        return;
      }
      goto LAB_0025cbe2;
    }
  }
  uVar12 = (uint)uVar4;
  if (uVar12 == 0) {
    uVar3 = 3;
    goto LAB_0025cbe2;
  }
  if (((uVar13 & 4) != 0) && (0xffff < uVar12)) {
    uVar6 = (uint)(uVar4 >> 0x10);
    w = uVar6 & 0xffff;
    if (((uVar6 & 0xffff) != 0x500) || ((uVar3 >> 0xb & 1) != 0 && uVar9 == 0x2000000)) {
      if ((uVar3 >> 0xb & 1) == 0) {
        anon_unknown_4::SortKeyLevel::appendWeight16(&local_f8,w);
      }
      else if (uVar9 - 1 < 0x2000000) {
        if (local_150 < local_f8.len + -1) {
          puVar5 = local_f8.buffer.ptr + local_150;
          puVar7 = local_f8.buffer.ptr + (long)local_f8.len + -2;
          do {
            uVar8 = *puVar5;
            *puVar5 = puVar7[1];
            puVar5 = puVar5 + 1;
            puVar7[1] = uVar8;
            bVar15 = puVar5 < puVar7;
            puVar7 = puVar7 + -1;
          } while (bVar15);
        }
        anon_unknown_4::SortKeyLevel::appendByte(&local_f8,(uVar9 != 1) + 1);
        local_150 = local_f8.len;
      }
      else {
        appendCapacity = 2 - (uint)((uVar4 & 0xff0000) == 0);
        if ((local_f8.len + appendCapacity <= local_f8.buffer.capacity) ||
           (UVar2 = anon_unknown_4::SortKeyLevel::ensureCapacity(&local_f8,appendCapacity),
           UVar2 != '\0')) {
          uVar8 = (uchar)(uVar4 >> 0x18);
          if ((uVar4 & 0xff0000) == 0) {
            local_f8.buffer.ptr[local_f8.len] = uVar8;
            local_f8.len = local_f8.len + 1;
          }
          else {
            local_f8.buffer.ptr[local_f8.len] = (uchar)w;
            local_f8.buffer.ptr[(long)local_f8.len + 1] = uVar8;
            local_f8.len = local_f8.len + 2;
          }
        }
      }
    }
  }
  if ((uVar13 & 8) != 0) {
    if (uVar3 < 0x1000) {
      if (uVar9 != 0) {
LAB_0025c808:
        bVar11 = (byte)(uVar4 >> 8);
        if (bVar11 < 2 || (uVar4 & 0xc000) != 0) {
          if ((uVar3 >> 8 & 1) == 0) {
            uVar9 = (uint32_t)bVar11;
            if (1 < uVar9) {
              uVar9 = ((uint)(uVar4 >> 10) & 0x30) + 0xd0;
            }
          }
          else {
            uVar9 = (uint32_t)bVar11;
            if (1 < uVar9) {
              uVar9 = ~uVar12 >> 10 & 0x30;
            }
          }
          anon_unknown_4::SortKeyLevel::appendByte(&local_70,uVar9);
        }
      }
    }
    else if (0xffff < uVar12) goto LAB_0025c808;
  }
  if (((uVar13 & 0x10) != 0) && (uVar6 = local_13c & uVar12, uVar6 != 0x500)) {
    if (local_140 == 0x200) {
      if ((uVar3 >> 8 & 1) == 0) {
        uVar9 = uVar6 + 0x4000;
        goto LAB_0025cabd;
      }
      uVar9 = uVar6;
      if (0x100 < uVar6) {
        if (uVar12 < 0x10000) {
          uVar9 = uVar6 + 0x4000;
        }
        else {
          uVar6 = uVar6 ^ 0xc000;
          uVar9 = uVar6 - 0x4000;
          if (0xc4ff < uVar6) {
            uVar9 = uVar6;
          }
        }
      }
    }
    else {
      uVar9 = uVar6 + 0xc000;
LAB_0025cabd:
      if (uVar6 < 0x501) {
        uVar9 = uVar6;
      }
    }
    anon_unknown_4::SortKeyLevel::appendWeight16(&local_b0,uVar9);
  }
  if (((uVar13 & 0x20) != 0) && (uVar13 = uVar12 & 0xffff, uVar13 < 0x101 || (uVar4 & 0xc0) != 0)) {
    if (((uVar3 & 0xc) == 0) && ((uVar13 == 0x100 && (local_138.len == 0)))) {
      anon_unknown_4::SortKeyLevel::appendByte(&local_138,1);
    }
    else {
      uVar9 = (uint)(uVar4 >> 6) & 0xff | 0xfc;
      if (uVar13 == 0x100) {
        uVar9 = 1;
      }
      anon_unknown_4::SortKeyLevel::appendByte(&local_138,uVar9);
    }
  }
  uVar3 = (uint)((uVar12 & 0xff000000) == 0x1000000) * 2;
LAB_0025cbe2:
  (*(code *)(&DAT_003a2460 + *(int *)(&DAT_003a2460 + (ulong)uVar3 * 4)))();
  return;
}

Assistant:

void
CollationKeys::writeSortKeyUpToQuaternary(CollationIterator &iter,
                                          const UBool *compressibleBytes,
                                          const CollationSettings &settings,
                                          SortKeyByteSink &sink,
                                          Collation::Level minLevel, LevelCallback &callback,
                                          UBool preflight, UErrorCode &errorCode) {
    if(U_FAILURE(errorCode)) { return; }

    int32_t options = settings.options;
    // Set of levels to process and write.
    uint32_t levels = levelMasks[CollationSettings::getStrength(options)];
    if((options & CollationSettings::CASE_LEVEL) != 0) {
        levels |= Collation::CASE_LEVEL_FLAG;
    }
    // Minus the levels below minLevel.
    levels &= ~(((uint32_t)1 << minLevel) - 1);
    if(levels == 0) { return; }

    uint32_t variableTop;
    if((options & CollationSettings::ALTERNATE_MASK) == 0) {
        variableTop = 0;
    } else {
        // +1 so that we can use "<" and primary ignorables test out early.
        variableTop = settings.variableTop + 1;
    }

    uint32_t tertiaryMask = CollationSettings::getTertiaryMask(options);

    SortKeyLevel cases;
    SortKeyLevel secondaries;
    SortKeyLevel tertiaries;
    SortKeyLevel quaternaries;

    uint32_t prevReorderedPrimary = 0;  // 0==no compression
    int32_t commonCases = 0;
    int32_t commonSecondaries = 0;
    int32_t commonTertiaries = 0;
    int32_t commonQuaternaries = 0;

    uint32_t prevSecondary = 0;
    int32_t secSegmentStart = 0;

    for(;;) {
        // No need to keep all CEs in the buffer when we write a sort key.
        iter.clearCEsIfNoneRemaining();
        int64_t ce = iter.nextCE(errorCode);
        uint32_t p = (uint32_t)(ce >> 32);
        if(p < variableTop && p > Collation::MERGE_SEPARATOR_PRIMARY) {
            // Variable CE, shift it to quaternary level.
            // Ignore all following primary ignorables, and shift further variable CEs.
            if(commonQuaternaries != 0) {
                --commonQuaternaries;
                while(commonQuaternaries >= QUAT_COMMON_MAX_COUNT) {
                    quaternaries.appendByte(QUAT_COMMON_MIDDLE);
                    commonQuaternaries -= QUAT_COMMON_MAX_COUNT;
                }
                // Shifted primary weights are lower than the common weight.
                quaternaries.appendByte(QUAT_COMMON_LOW + commonQuaternaries);
                commonQuaternaries = 0;
            }
            do {
                if((levels & Collation::QUATERNARY_LEVEL_FLAG) != 0) {
                    if(settings.hasReordering()) {
                        p = settings.reorder(p);
                    }
                    if((p >> 24) >= QUAT_SHIFTED_LIMIT_BYTE) {
                        // Prevent shifted primary lead bytes from
                        // overlapping with the common compression range.
                        quaternaries.appendByte(QUAT_SHIFTED_LIMIT_BYTE);
                    }
                    quaternaries.appendWeight32(p);
                }
                do {
                    ce = iter.nextCE(errorCode);
                    p = (uint32_t)(ce >> 32);
                } while(p == 0);
            } while(p < variableTop && p > Collation::MERGE_SEPARATOR_PRIMARY);
        }
        // ce could be primary ignorable, or NO_CE, or the merge separator,
        // or a regular primary CE, but it is not variable.
        // If ce==NO_CE, then write nothing for the primary level but
        // terminate compression on all levels and then exit the loop.
        if(p > Collation::NO_CE_PRIMARY && (levels & Collation::PRIMARY_LEVEL_FLAG) != 0) {
            // Test the un-reordered primary for compressibility.
            UBool isCompressible = compressibleBytes[p >> 24];
            if(settings.hasReordering()) {
                p = settings.reorder(p);
            }
            uint32_t p1 = p >> 24;
            if(!isCompressible || p1 != (prevReorderedPrimary >> 24)) {
                if(prevReorderedPrimary != 0) {
                    if(p < prevReorderedPrimary) {
                        // No primary compression terminator
                        // at the end of the level or merged segment.
                        if(p1 > Collation::MERGE_SEPARATOR_BYTE) {
                            sink.Append(Collation::PRIMARY_COMPRESSION_LOW_BYTE);
                        }
                    } else {
                        sink.Append(Collation::PRIMARY_COMPRESSION_HIGH_BYTE);
                    }
                }
                sink.Append(p1);
                if(isCompressible) {
                    prevReorderedPrimary = p;
                } else {
                    prevReorderedPrimary = 0;
                }
            }
            char p2 = (char)(p >> 16);
            if(p2 != 0) {
                char buffer[3] = { p2, (char)(p >> 8), (char)p };
                sink.Append(buffer, (buffer[1] == 0) ? 1 : (buffer[2] == 0) ? 2 : 3);
            }
            // Optimization for internalNextSortKeyPart():
            // When the primary level overflows we can stop because we need not
            // calculate (preflight) the whole sort key length.
            if(!preflight && sink.Overflowed()) {
                if(U_SUCCESS(errorCode) && !sink.IsOk()) {
                    errorCode = U_MEMORY_ALLOCATION_ERROR;
                }
                return;
            }
        }

        uint32_t lower32 = (uint32_t)ce;
        if(lower32 == 0) { continue; }  // completely ignorable, no secondary/case/tertiary/quaternary

        if((levels & Collation::SECONDARY_LEVEL_FLAG) != 0) {
            uint32_t s = lower32 >> 16;
            if(s == 0) {
                // secondary ignorable
            } else if(s == Collation::COMMON_WEIGHT16 &&
                    ((options & CollationSettings::BACKWARD_SECONDARY) == 0 ||
                        p != Collation::MERGE_SEPARATOR_PRIMARY)) {
                // s is a common secondary weight, and
                // backwards-secondary is off or the ce is not the merge separator.
                ++commonSecondaries;
            } else if((options & CollationSettings::BACKWARD_SECONDARY) == 0) {
                if(commonSecondaries != 0) {
                    --commonSecondaries;
                    while(commonSecondaries >= SEC_COMMON_MAX_COUNT) {
                        secondaries.appendByte(SEC_COMMON_MIDDLE);
                        commonSecondaries -= SEC_COMMON_MAX_COUNT;
                    }
                    uint32_t b;
                    if(s < Collation::COMMON_WEIGHT16) {
                        b = SEC_COMMON_LOW + commonSecondaries;
                    } else {
                        b = SEC_COMMON_HIGH - commonSecondaries;
                    }
                    secondaries.appendByte(b);
                    commonSecondaries = 0;
                }
                secondaries.appendWeight16(s);
            } else {
                if(commonSecondaries != 0) {
                    --commonSecondaries;
                    // Append reverse weights. The level will be re-reversed later.
                    int32_t remainder = commonSecondaries % SEC_COMMON_MAX_COUNT;
                    uint32_t b;
                    if(prevSecondary < Collation::COMMON_WEIGHT16) {
                        b = SEC_COMMON_LOW + remainder;
                    } else {
                        b = SEC_COMMON_HIGH - remainder;
                    }
                    secondaries.appendByte(b);
                    commonSecondaries -= remainder;
                    // commonSecondaries is now a multiple of SEC_COMMON_MAX_COUNT.
                    while(commonSecondaries > 0) {  // same as >= SEC_COMMON_MAX_COUNT
                        secondaries.appendByte(SEC_COMMON_MIDDLE);
                        commonSecondaries -= SEC_COMMON_MAX_COUNT;
                    }
                    // commonSecondaries == 0
                }
                if(0 < p && p <= Collation::MERGE_SEPARATOR_PRIMARY) {
                    // The backwards secondary level compares secondary weights backwards
                    // within segments separated by the merge separator (U+FFFE).
                    uint8_t *secs = secondaries.data();
                    int32_t last = secondaries.length() - 1;
                    if(secSegmentStart < last) {
                        uint8_t *q = secs + secSegmentStart;
                        uint8_t *r = secs + last;
                        do {
                            uint8_t b = *q;
                            *q++ = *r;
                            *r-- = b;
                        } while(q < r);
                    }
                    secondaries.appendByte(p == Collation::NO_CE_PRIMARY ?
                        Collation::LEVEL_SEPARATOR_BYTE : Collation::MERGE_SEPARATOR_BYTE);
                    prevSecondary = 0;
                    secSegmentStart = secondaries.length();
                } else {
                    secondaries.appendReverseWeight16(s);
                    prevSecondary = s;
                }
            }
        }

        if((levels & Collation::CASE_LEVEL_FLAG) != 0) {
            if((CollationSettings::getStrength(options) == UCOL_PRIMARY) ?
                    p == 0 : lower32 <= 0xffff) {
                // Primary+caseLevel: Ignore case level weights of primary ignorables.
                // Otherwise: Ignore case level weights of secondary ignorables.
                // For details see the comments in the CollationCompare class.
            } else {
                uint32_t c = (lower32 >> 8) & 0xff;  // case bits & tertiary lead byte
                U_ASSERT((c & 0xc0) != 0xc0);
                if((c & 0xc0) == 0 && c > Collation::LEVEL_SEPARATOR_BYTE) {
                    ++commonCases;
                } else {
                    if((options & CollationSettings::UPPER_FIRST) == 0) {
                        // lowerFirst: Compress common weights to nibbles 1..7..13, mixed=14, upper=15.
                        // If there are only common (=lowest) weights in the whole level,
                        // then we need not write anything.
                        // Level length differences are handled already on the next-higher level.
                        if(commonCases != 0 &&
                                (c > Collation::LEVEL_SEPARATOR_BYTE || !cases.isEmpty())) {
                            --commonCases;
                            while(commonCases >= CASE_LOWER_FIRST_COMMON_MAX_COUNT) {
                                cases.appendByte(CASE_LOWER_FIRST_COMMON_MIDDLE << 4);
                                commonCases -= CASE_LOWER_FIRST_COMMON_MAX_COUNT;
                            }
                            uint32_t b;
                            if(c <= Collation::LEVEL_SEPARATOR_BYTE) {
                                b = CASE_LOWER_FIRST_COMMON_LOW + commonCases;
                            } else {
                                b = CASE_LOWER_FIRST_COMMON_HIGH - commonCases;
                            }
                            cases.appendByte(b << 4);
                            commonCases = 0;
                        }
                        if(c > Collation::LEVEL_SEPARATOR_BYTE) {
                            c = (CASE_LOWER_FIRST_COMMON_HIGH + (c >> 6)) << 4;  // 14 or 15
                        }
                    } else {
                        // upperFirst: Compress common weights to nibbles 3..15, mixed=2, upper=1.
                        // The compressed common case weights only go up from the "low" value
                        // because with upperFirst the common weight is the highest one.
                        if(commonCases != 0) {
                            --commonCases;
                            while(commonCases >= CASE_UPPER_FIRST_COMMON_MAX_COUNT) {
                                cases.appendByte(CASE_UPPER_FIRST_COMMON_LOW << 4);
                                commonCases -= CASE_UPPER_FIRST_COMMON_MAX_COUNT;
                            }
                            cases.appendByte((CASE_UPPER_FIRST_COMMON_LOW + commonCases) << 4);
                            commonCases = 0;
                        }
                        if(c > Collation::LEVEL_SEPARATOR_BYTE) {
                            c = (CASE_UPPER_FIRST_COMMON_LOW - (c >> 6)) << 4;  // 2 or 1
                        }
                    }
                    // c is a separator byte 01,
                    // or a left-shifted nibble 0x10, 0x20, ... 0xf0.
                    cases.appendByte(c);
                }
            }
        }

        if((levels & Collation::TERTIARY_LEVEL_FLAG) != 0) {
            uint32_t t = lower32 & tertiaryMask;
            U_ASSERT((lower32 & 0xc000) != 0xc000);
            if(t == Collation::COMMON_WEIGHT16) {
                ++commonTertiaries;
            } else if((tertiaryMask & 0x8000) == 0) {
                // Tertiary weights without case bits.
                // Move lead bytes 06..3F to C6..FF for a large common-weight range.
                if(commonTertiaries != 0) {
                    --commonTertiaries;
                    while(commonTertiaries >= TER_ONLY_COMMON_MAX_COUNT) {
                        tertiaries.appendByte(TER_ONLY_COMMON_MIDDLE);
                        commonTertiaries -= TER_ONLY_COMMON_MAX_COUNT;
                    }
                    uint32_t b;
                    if(t < Collation::COMMON_WEIGHT16) {
                        b = TER_ONLY_COMMON_LOW + commonTertiaries;
                    } else {
                        b = TER_ONLY_COMMON_HIGH - commonTertiaries;
                    }
                    tertiaries.appendByte(b);
                    commonTertiaries = 0;
                }
                if(t > Collation::COMMON_WEIGHT16) { t += 0xc000; }
                tertiaries.appendWeight16(t);
            } else if((options & CollationSettings::UPPER_FIRST) == 0) {
                // Tertiary weights with caseFirst=lowerFirst.
                // Move lead bytes 06..BF to 46..FF for the common-weight range.
                if(commonTertiaries != 0) {
                    --commonTertiaries;
                    while(commonTertiaries >= TER_LOWER_FIRST_COMMON_MAX_COUNT) {
                        tertiaries.appendByte(TER_LOWER_FIRST_COMMON_MIDDLE);
                        commonTertiaries -= TER_LOWER_FIRST_COMMON_MAX_COUNT;
                    }
                    uint32_t b;
                    if(t < Collation::COMMON_WEIGHT16) {
                        b = TER_LOWER_FIRST_COMMON_LOW + commonTertiaries;
                    } else {
                        b = TER_LOWER_FIRST_COMMON_HIGH - commonTertiaries;
                    }
                    tertiaries.appendByte(b);
                    commonTertiaries = 0;
                }
                if(t > Collation::COMMON_WEIGHT16) { t += 0x4000; }
                tertiaries.appendWeight16(t);
            } else {
                // Tertiary weights with caseFirst=upperFirst.
                // Do not change the artificial uppercase weight of a tertiary CE (0.0.ut),
                // to keep tertiary CEs well-formed.
                // Their case+tertiary weights must be greater than those of
                // primary and secondary CEs.
                //
                // Separator         01 -> 01      (unchanged)
                // Lowercase     02..04 -> 82..84  (includes uncased)
                // Common weight     05 -> 85..C5  (common-weight compression range)
                // Lowercase     06..3F -> C6..FF
                // Mixed case    42..7F -> 42..7F
                // Uppercase     82..BF -> 02..3F
                // Tertiary CE   86..BF -> C6..FF
                if(t <= Collation::NO_CE_WEIGHT16) {
                    // Keep separators unchanged.
                } else if(lower32 > 0xffff) {
                    // Invert case bits of primary & secondary CEs.
                    t ^= 0xc000;
                    if(t < (TER_UPPER_FIRST_COMMON_HIGH << 8)) {
                        t -= 0x4000;
                    }
                } else {
                    // Keep uppercase bits of tertiary CEs.
                    U_ASSERT(0x8600 <= t && t <= 0xbfff);
                    t += 0x4000;
                }
                if(commonTertiaries != 0) {
                    --commonTertiaries;
                    while(commonTertiaries >= TER_UPPER_FIRST_COMMON_MAX_COUNT) {
                        tertiaries.appendByte(TER_UPPER_FIRST_COMMON_MIDDLE);
                        commonTertiaries -= TER_UPPER_FIRST_COMMON_MAX_COUNT;
                    }
                    uint32_t b;
                    if(t < (TER_UPPER_FIRST_COMMON_LOW << 8)) {
                        b = TER_UPPER_FIRST_COMMON_LOW + commonTertiaries;
                    } else {
                        b = TER_UPPER_FIRST_COMMON_HIGH - commonTertiaries;
                    }
                    tertiaries.appendByte(b);
                    commonTertiaries = 0;
                }
                tertiaries.appendWeight16(t);
            }
        }

        if((levels & Collation::QUATERNARY_LEVEL_FLAG) != 0) {
            uint32_t q = lower32 & 0xffff;
            if((q & 0xc0) == 0 && q > Collation::NO_CE_WEIGHT16) {
                ++commonQuaternaries;
            } else if(q == Collation::NO_CE_WEIGHT16 &&
                    (options & CollationSettings::ALTERNATE_MASK) == 0 &&
                    quaternaries.isEmpty()) {
                // If alternate=non-ignorable and there are only common quaternary weights,
                // then we need not write anything.
                // The only weights greater than the merge separator and less than the common weight
                // are shifted primary weights, which are not generated for alternate=non-ignorable.
                // There are also exactly as many quaternary weights as tertiary weights,
                // so level length differences are handled already on tertiary level.
                // Any above-common quaternary weight will compare greater regardless.
                quaternaries.appendByte(Collation::LEVEL_SEPARATOR_BYTE);
            } else {
                if(q == Collation::NO_CE_WEIGHT16) {
                    q = Collation::LEVEL_SEPARATOR_BYTE;
                } else {
                    q = 0xfc + ((q >> 6) & 3);
                }
                if(commonQuaternaries != 0) {
                    --commonQuaternaries;
                    while(commonQuaternaries >= QUAT_COMMON_MAX_COUNT) {
                        quaternaries.appendByte(QUAT_COMMON_MIDDLE);
                        commonQuaternaries -= QUAT_COMMON_MAX_COUNT;
                    }
                    uint32_t b;
                    if(q < QUAT_COMMON_LOW) {
                        b = QUAT_COMMON_LOW + commonQuaternaries;
                    } else {
                        b = QUAT_COMMON_HIGH - commonQuaternaries;
                    }
                    quaternaries.appendByte(b);
                    commonQuaternaries = 0;
                }
                quaternaries.appendByte(q);
            }
        }

        if((lower32 >> 24) == Collation::LEVEL_SEPARATOR_BYTE) { break; }  // ce == NO_CE
    }

    if(U_FAILURE(errorCode)) { return; }

    // Append the beyond-primary levels.
    UBool ok = TRUE;
    if((levels & Collation::SECONDARY_LEVEL_FLAG) != 0) {
        if(!callback.needToWrite(Collation::SECONDARY_LEVEL)) { return; }
        ok &= secondaries.isOk();
        sink.Append(Collation::LEVEL_SEPARATOR_BYTE);
        secondaries.appendTo(sink);
    }

    if((levels & Collation::CASE_LEVEL_FLAG) != 0) {
        if(!callback.needToWrite(Collation::CASE_LEVEL)) { return; }
        ok &= cases.isOk();
        sink.Append(Collation::LEVEL_SEPARATOR_BYTE);
        // Write pairs of nibbles as bytes, except separator bytes as themselves.
        int32_t length = cases.length() - 1;  // Ignore the trailing NO_CE.
        uint8_t b = 0;
        for(int32_t i = 0; i < length; ++i) {
            uint8_t c = (uint8_t)cases[i];
            U_ASSERT((c & 0xf) == 0 && c != 0);
            if(b == 0) {
                b = c;
            } else {
                sink.Append(b | (c >> 4));
                b = 0;
            }
        }
        if(b != 0) {
            sink.Append(b);
        }
    }

    if((levels & Collation::TERTIARY_LEVEL_FLAG) != 0) {
        if(!callback.needToWrite(Collation::TERTIARY_LEVEL)) { return; }
        ok &= tertiaries.isOk();
        sink.Append(Collation::LEVEL_SEPARATOR_BYTE);
        tertiaries.appendTo(sink);
    }

    if((levels & Collation::QUATERNARY_LEVEL_FLAG) != 0) {
        if(!callback.needToWrite(Collation::QUATERNARY_LEVEL)) { return; }
        ok &= quaternaries.isOk();
        sink.Append(Collation::LEVEL_SEPARATOR_BYTE);
        quaternaries.appendTo(sink);
    }

    if(!ok || !sink.IsOk()) {
        errorCode = U_MEMORY_ALLOCATION_ERROR;
    }
}